

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall google::anon_unknown_10::LogFileObject::FlushUnlocked(LogFileObject *this)

{
  long lVar1;
  int64 iVar2;
  int64 iVar3;
  
  if ((FILE *)this->file_ != (FILE *)0x0) {
    fflush((FILE *)this->file_);
    this->bytes_since_flush_ = 0;
  }
  lVar1 = (long)fLI::FLAGS_logbufsecs;
  iVar2 = glog_internal_namespace_::CycleClock_Now();
  iVar3 = glog_internal_namespace_::UsecToCycles(lVar1 * 1000000);
  this->next_flush_time_ = iVar3 + iVar2;
  return;
}

Assistant:

void LogFileObject::FlushUnlocked(){
  if (file_ != NULL) {
    fflush(file_);
    bytes_since_flush_ = 0;
  }
  // Figure out when we are due for another flush.
  const int64 next = (FLAGS_logbufsecs
                      * static_cast<int64>(1000000));  // in usec
  next_flush_time_ = CycleClock_Now() + UsecToCycles(next);
}